

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O2

void anon_unknown.dwarf_acf0eb::ProcessMetadata
               (uint64_t relDefinesByPropertiesID,ConversionData *conv,Metadata *properties)

{
  DB *this;
  LazyObject *pLVar1;
  IfcRelDefinesByProperties *pIVar2;
  IfcPropertySetDefinition *pIVar3;
  IfcPropertySet *pIVar4;
  uint in_R8D;
  allocator<char> local_39;
  string local_38 [32];
  
  pLVar1 = Assimp::STEP::DB::GetObject(conv->db,relDefinesByPropertiesID);
  pIVar2 = Assimp::STEP::LazyObject::ToPtr<Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties>
                     (pLVar1);
  if (pIVar2 != (IfcRelDefinesByProperties *)0x0) {
    this = conv->db;
    pIVar3 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>::operator->
                       ((Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition> *)
                        &(pIVar2->super_IfcRelDefines).field_0xd0);
    pLVar1 = Assimp::STEP::DB::GetObject
                       (this,*(uint64_t *)
                              ((pIVar3->super_IfcPropertyDefinition).super_IfcRoot.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                               _vptr_ObjectHelper[-3] +
                              (long)&(pIVar3->super_IfcPropertyDefinition).super_IfcRoot.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                     aux_is_derived.super__Base_bitset<1UL>));
    pIVar4 = Assimp::STEP::LazyObject::ToPtr<Assimp::IFC::Schema_2x3::IfcPropertySet>(pLVar1);
    if (pIVar4 != (IfcPropertySet *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
      ProcessMetadata((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *)
                      &(pIVar4->super_IfcPropertySetDefinition).field_0xb8,
                      (ConversionData *)properties,(Metadata *)local_38,(string *)0x0,in_R8D);
      std::__cxx11::string::~string(local_38);
    }
  }
  return;
}

Assistant:

void ProcessMetadata(uint64_t relDefinesByPropertiesID, ConversionData& conv, Metadata& properties)
{
    if (const Schema_2x3::IfcRelDefinesByProperties* const pset = conv.db.GetObject(relDefinesByPropertiesID)->ToPtr<Schema_2x3::IfcRelDefinesByProperties>()) {
        if (const Schema_2x3::IfcPropertySet* const set = conv.db.GetObject(pset->RelatingPropertyDefinition->GetID())->ToPtr<Schema_2x3::IfcPropertySet>()) {
            ProcessMetadata(set->HasProperties, conv, properties);
        }
    }
}